

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O1

void __thiscall mraa::Iio::writeFloat(Iio *this,string *attributeName,float value)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  iVar1 = mraa_iio_write_float(this->m_iio,(attributeName->_M_dataplus)._M_p);
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"IIO writeFloat for attibute ",0x1c);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(attributeName->_M_dataplus)._M_p,
                      attributeName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed",7);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
    writeFloat(const std::string& attributeName, float value) const
    {
        mraa_result_t res = mraa_iio_write_float(m_iio, attributeName.c_str(), value);
        if (res != MRAA_SUCCESS) {
            std::ostringstream oss;
            oss << "IIO writeFloat for attibute " << attributeName << " failed";
            throw std::runtime_error(oss.str());
        }
    }